

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

InplaceStr GetTypeConstructorName(InplaceStr functionName)

{
  InplaceStr IVar1;
  InplaceStr local_40;
  char *local_30;
  char *pos;
  InplaceStr functionName_local;
  
  functionName_local.begin = functionName.end;
  pos = functionName.begin;
  local_30 = functionName_local.begin;
  do {
    if (local_30 <= pos) {
LAB_001aeee5:
      IVar1.end = functionName_local.begin;
      IVar1.begin = pos;
      return IVar1;
    }
    if (*local_30 == '.') {
      InplaceStr::InplaceStr(&local_40,local_30 + 1,functionName_local.begin);
      pos = local_40.begin;
      functionName_local.begin = local_40.end;
      goto LAB_001aeee5;
    }
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

InplaceStr GetTypeConstructorName(InplaceStr functionName)
{
	// TODO: add type scopes and lookup owner namespace
	for(const char *pos = functionName.end; pos > functionName.begin; pos--)
	{
		if(*pos == '.')
		{
			functionName = InplaceStr(pos + 1, functionName.end);
			break;
		}
	}

	return functionName;
}